

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall phosg::Image::set_has_alpha(Image *this,bool new_has_alpha)

{
  byte bVar1;
  uint64_t uVar2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  if (this->has_alpha != new_has_alpha) {
    this->has_alpha = new_has_alpha;
    lVar8 = this->height * this->width;
    uVar7 = (ulong)new_has_alpha;
    bVar1 = this->channel_width;
    pvVar4 = malloc((ulong)(bVar1 >> 3) * (uVar7 + 3) * lVar8);
    if (0 < lVar8) {
      uVar2 = this->max_value;
      pvVar3 = (this->data).raw;
      lVar5 = 3;
      lVar6 = 2;
      do {
        switch(bVar1 << 5 | (byte)(bVar1 - 8) >> 3) {
        case 0:
          *(undefined1 *)((long)pvVar4 + lVar5 + -3) = *(undefined1 *)((long)pvVar3 + lVar6 + -2);
          *(undefined1 *)((long)pvVar4 + lVar5 + -2) = *(undefined1 *)((long)pvVar3 + lVar6 + -1);
          *(undefined1 *)((long)pvVar4 + lVar5 + -1) = *(undefined1 *)((long)pvVar3 + lVar6);
          if (new_has_alpha) {
            *(char *)((long)pvVar4 + lVar5) = (char)uVar2;
          }
          break;
        case 1:
          *(undefined2 *)((long)pvVar4 + lVar5 * 2 + -6) =
               *(undefined2 *)((long)pvVar3 + lVar6 * 2 + -4);
          *(undefined2 *)((long)pvVar4 + lVar5 * 2 + -4) =
               *(undefined2 *)((long)pvVar3 + lVar6 * 2 + -2);
          *(undefined2 *)((long)pvVar4 + lVar5 * 2 + -2) = *(undefined2 *)((long)pvVar3 + lVar6 * 2)
          ;
          if (new_has_alpha) {
            *(short *)((long)pvVar4 + lVar5 * 2) = (short)uVar2;
          }
          break;
        case 3:
          *(undefined4 *)((long)pvVar4 + lVar5 * 4 + -0xc) =
               *(undefined4 *)((long)pvVar3 + lVar6 * 4 + -8);
          *(undefined4 *)((long)pvVar4 + lVar5 * 4 + -8) =
               *(undefined4 *)((long)pvVar3 + lVar6 * 4 + -4);
          *(undefined4 *)((long)pvVar4 + lVar5 * 4 + -4) = *(undefined4 *)((long)pvVar3 + lVar6 * 4)
          ;
          if (new_has_alpha) {
            *(int *)((long)pvVar4 + lVar5 * 4) = (int)uVar2;
          }
          break;
        case 7:
          *(undefined8 *)((long)pvVar4 + lVar5 * 8 + -0x18) =
               *(undefined8 *)((long)pvVar3 + lVar6 * 8 + -0x10);
          *(undefined8 *)((long)pvVar4 + lVar5 * 8 + -0x10) =
               *(undefined8 *)((long)pvVar3 + lVar6 * 8 + -8);
          *(undefined8 *)((long)pvVar4 + lVar5 * 8 + -8) = *(undefined8 *)((long)pvVar3 + lVar6 * 8)
          ;
          if (new_has_alpha) {
            *(uint64_t *)((long)pvVar4 + lVar5 * 8) = uVar2;
          }
        }
        lVar5 = lVar5 + uVar7 + 3;
        lVar6 = lVar6 + (4 - uVar7);
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    free((this->data).raw);
    (this->data).raw = pvVar4;
  }
  return;
}

Assistant:

void Image::set_has_alpha(bool new_has_alpha) {
  if (this->has_alpha == new_has_alpha) {
    return;
  }
  this->has_alpha = new_has_alpha;

  DataPtrs new_data;
  new_data.raw = malloc(this->get_data_size());

  for (ssize_t z = 0; z < this->width * this->height; z++) {
    size_t src_index = z * (this->has_alpha ? 3 : 4);
    size_t dst_index = z * (this->has_alpha ? 4 : 3);

    if (this->channel_width == 8) {
      new_data.as8[dst_index + 0] = this->data.as8[src_index + 0];
      new_data.as8[dst_index + 1] = this->data.as8[src_index + 1];
      new_data.as8[dst_index + 2] = this->data.as8[src_index + 2];
      if (this->has_alpha) {
        new_data.as8[dst_index + 3] = this->max_value;
      }
    } else if (this->channel_width == 16) {
      new_data.as16[dst_index + 0] = this->data.as16[src_index + 0];
      new_data.as16[dst_index + 1] = this->data.as16[src_index + 1];
      new_data.as16[dst_index + 2] = this->data.as16[src_index + 2];
      if (this->has_alpha) {
        new_data.as16[dst_index + 3] = this->max_value;
      }
    } else if (this->channel_width == 32) {
      new_data.as32[dst_index + 0] = this->data.as32[src_index + 0];
      new_data.as32[dst_index + 1] = this->data.as32[src_index + 1];
      new_data.as32[dst_index + 2] = this->data.as32[src_index + 2];
      if (this->has_alpha) {
        new_data.as32[dst_index + 3] = this->max_value;
      }
    } else if (this->channel_width == 64) {
      new_data.as64[dst_index + 0] = this->data.as64[src_index + 0];
      new_data.as64[dst_index + 1] = this->data.as64[src_index + 1];
      new_data.as64[dst_index + 2] = this->data.as64[src_index + 2];
      if (this->has_alpha) {
        new_data.as64[dst_index + 3] = this->max_value;
      }
    }
  }

  free(this->data.raw);
  this->data.raw = new_data.raw;
}